

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O2

void __thiscall FConfigFile::ClearConfig(FConfigFile *this)

{
  FConfigSection *this_00;
  FConfigSection *pFVar1;
  
  pFVar1 = this->Sections;
  while (this->CurrentSection = pFVar1, pFVar1 != (FConfigSection *)0x0) {
    pFVar1 = pFVar1->Next;
    ClearCurrentSection(this);
    this_00 = this->CurrentSection;
    if (this_00 != (FConfigSection *)0x0) {
      FConfigSection::~FConfigSection(this_00);
    }
    operator_delete(this_00,0x28);
  }
  this->Sections = (FConfigSection *)0x0;
  this->LastSectionPtr = &this->Sections;
  return;
}

Assistant:

void FConfigFile::ClearConfig ()
{
	CurrentSection = Sections;
	while (CurrentSection != NULL)
	{
		FConfigSection *next = CurrentSection->Next;
		ClearCurrentSection ();
		delete CurrentSection;
		CurrentSection = next;
	}
	Sections = NULL;
	LastSectionPtr = &Sections;
}